

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O0

int mbedtls_pk_parse_public_keyfile(mbedtls_pk_context *ctx,char *path)

{
  uchar *local_38;
  uchar *buf;
  size_t n;
  char *pcStack_20;
  int ret;
  char *path_local;
  mbedtls_pk_context *ctx_local;
  
  pcStack_20 = path;
  path_local = (char *)ctx;
  n._4_4_ = mbedtls_pk_load_file(path,&local_38,(size_t *)&buf);
  ctx_local._4_4_ = n._4_4_;
  if (n._4_4_ == 0) {
    n._4_4_ = mbedtls_pk_parse_public_key((mbedtls_pk_context *)path_local,local_38,(size_t)buf);
    mbedtls_zeroize(local_38,(size_t)buf);
    free(local_38);
    ctx_local._4_4_ = n._4_4_;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_pk_parse_public_keyfile( mbedtls_pk_context *ctx, const char *path )
{
    int ret;
    size_t n;
    unsigned char *buf;

    if( ( ret = mbedtls_pk_load_file( path, &buf, &n ) ) != 0 )
        return( ret );

    ret = mbedtls_pk_parse_public_key( ctx, buf, n );

    mbedtls_zeroize( buf, n );
    mbedtls_free( buf );

    return( ret );
}